

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsStateQueryUtil.hpp
# Opt level: O0

bool __thiscall
deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<unsigned_int>::verifyValidity
          (StateQueryMemoryWriteGuard<unsigned_int> *this,TestContext *testCtx)

{
  bool bVar1;
  qpTestResult qVar2;
  TestLog *pTVar3;
  MessageBuilder *pMVar4;
  MessageBuilder local_4b0;
  MessageBuilder local_330;
  MessageBuilder local_1a0;
  TestContext *local_20;
  TestContext *testCtx_local;
  StateQueryMemoryWriteGuard<unsigned_int> *this_local;
  
  local_20 = testCtx;
  testCtx_local = (TestContext *)this;
  bVar1 = isPreguardContaminated(this);
  if (bVar1) {
    pTVar3 = tcu::TestContext::getLog(local_20);
    tcu::TestLog::operator<<(&local_1a0,pTVar3,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar4 = tcu::MessageBuilder::operator<<
                       (&local_1a0,(char (*) [40])"// ERROR: Pre-guard value was modified ");
    tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1a0);
    qVar2 = tcu::TestContext::getTestResult(local_20);
    if ((qVar2 == QP_TEST_RESULT_PASS) ||
       (qVar2 = tcu::TestContext::getTestResult(local_20), qVar2 == QP_TEST_RESULT_LAST)) {
      tcu::TestContext::setTestResult
                (local_20,QP_TEST_RESULT_FAIL,"Get* did an illegal memory write");
    }
    return false;
  }
  bVar1 = isPostguardContaminated(this);
  if (bVar1) {
    pTVar3 = tcu::TestContext::getLog(local_20);
    tcu::TestLog::operator<<(&local_330,pTVar3,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar4 = tcu::MessageBuilder::operator<<
                       (&local_330,(char (*) [41])"// ERROR: Post-guard value was modified ");
    tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_330);
    qVar2 = tcu::TestContext::getTestResult(local_20);
    if ((qVar2 == QP_TEST_RESULT_PASS) ||
       (qVar2 = tcu::TestContext::getTestResult(local_20), qVar2 == QP_TEST_RESULT_LAST)) {
      tcu::TestContext::setTestResult
                (local_20,QP_TEST_RESULT_FAIL,"Get* did an illegal memory write");
    }
    return false;
  }
  bVar1 = isUndefined(this);
  if (bVar1) {
    pTVar3 = tcu::TestContext::getLog(local_20);
    tcu::TestLog::operator<<(&local_4b0,pTVar3,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar4 = tcu::MessageBuilder::operator<<
                       (&local_4b0,(char (*) [38])"// ERROR: Get* did not return a value");
    tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_4b0);
    qVar2 = tcu::TestContext::getTestResult(local_20);
    if ((qVar2 == QP_TEST_RESULT_PASS) ||
       (qVar2 = tcu::TestContext::getTestResult(local_20), qVar2 == QP_TEST_RESULT_LAST)) {
      tcu::TestContext::setTestResult(local_20,QP_TEST_RESULT_FAIL,"Get* did not return a value");
    }
    return false;
  }
  return true;
}

Assistant:

bool StateQueryMemoryWriteGuard<T>::verifyValidity (tcu::TestContext& testCtx) const
{
	using tcu::TestLog;

	if (isPreguardContaminated())
	{
		testCtx.getLog() << TestLog::Message << "// ERROR: Pre-guard value was modified " << TestLog::EndMessage;
		if (testCtx.getTestResult() == QP_TEST_RESULT_PASS ||
			testCtx.getTestResult() == QP_TEST_RESULT_LAST)
			testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Get* did an illegal memory write");

		return false;
	}
	else if (isPostguardContaminated())
	{
		testCtx.getLog() << TestLog::Message << "// ERROR: Post-guard value was modified " << TestLog::EndMessage;
		if (testCtx.getTestResult() == QP_TEST_RESULT_PASS ||
			testCtx.getTestResult() == QP_TEST_RESULT_LAST)
			testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Get* did an illegal memory write");

		return false;
	}
	else if (isUndefined())
	{
		testCtx.getLog() << TestLog::Message << "// ERROR: Get* did not return a value" << TestLog::EndMessage;
		if (testCtx.getTestResult() == QP_TEST_RESULT_PASS ||
			testCtx.getTestResult() == QP_TEST_RESULT_LAST)
			testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Get* did not return a value");

		return false;
	}

	return true;
}